

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O2

Filter * __thiscall
helics::make_filter(helics *this,InterfaceVisibility locality,FilterTypes type,Federate *mFed,
                   string_view name)

{
  Filter *filt;
  undefined4 in_register_00000014;
  Federate *this_00;
  Core *extraout_RDX;
  Core *extraout_RDX_00;
  Core *extraout_RDX_01;
  Core *extraout_RDX_02;
  Core *pCVar1;
  char *pcVar2;
  string_view filterName;
  string_view filterName_00;
  string_view filterName_01;
  string_view filterName_02;
  
  this_00 = (Federate *)CONCAT44(in_register_00000014,type);
  pcVar2 = (char *)name._M_len;
  if (locality == 5) {
    if ((int)this == 1) {
      filterName._M_str = pcVar2;
      filterName._M_len = (size_t)mFed;
      filt = &Federate::registerGlobalCloningFilter
                        (this_00,filterName,(string_view)ZEXT816(0),(string_view)ZEXT816(0))->
              super_Filter;
      pCVar1 = extraout_RDX;
    }
    else {
      filterName_01._M_str = pcVar2;
      filterName_01._M_len = (size_t)mFed;
      filt = &Federate::registerCloningFilter
                        (this_00,filterName_01,(string_view)ZEXT816(0),(string_view)ZEXT816(0))->
              super_Filter;
      pCVar1 = extraout_RDX_01;
    }
    addOperations(filt,CLONE,pCVar1);
    (*(filt->super_Interface)._vptr_Interface[6])(filt,8,"delivery",mFed,pcVar2);
  }
  else {
    if ((int)this == 1) {
      filterName_00._M_str = pcVar2;
      filterName_00._M_len = (size_t)mFed;
      filt = Federate::registerGlobalFilter
                       (this_00,filterName_00,(string_view)ZEXT816(0),(string_view)ZEXT816(0));
      pCVar1 = extraout_RDX_00;
    }
    else {
      filterName_02._M_str = pcVar2;
      filterName_02._M_len = (size_t)mFed;
      filt = Federate::registerFilter
                       (this_00,filterName_02,(string_view)ZEXT816(0),(string_view)ZEXT816(0));
      pCVar1 = extraout_RDX_02;
    }
    addOperations(filt,locality,pCVar1);
  }
  return filt;
}

Assistant:

Filter& make_filter(InterfaceVisibility locality,
                    FilterTypes type,
                    Federate* mFed,
                    std::string_view name)
{
    if (type == FilterTypes::CLONE) {
        Filter& dfilt = (locality == InterfaceVisibility::GLOBAL) ?
            mFed->registerGlobalCloningFilter(name) :
            mFed->registerCloningFilter(name);
        addOperations(&dfilt, type, mFed->getCorePointer().get());
        dfilt.setString("delivery", name);
        return dfilt;
    }
    auto& dfilt = (locality == InterfaceVisibility::GLOBAL) ? mFed->registerGlobalFilter(name) :
                                                              mFed->registerFilter(name);
    addOperations(&dfilt, type, nullptr);
    return dfilt;
}